

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  long lVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  ImDrawIdx *pIVar5;
  ImVec2 IVar6;
  ImDrawIdx IVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ImDrawIdx IVar11;
  char cVar12;
  long lVar13;
  ImDrawIdx IVar14;
  int iVar15;
  ImVec2 *pIVar16;
  ImDrawIdx IVar17;
  ulong uVar18;
  undefined7 in_register_00000081;
  undefined8 *puVar19;
  float *pfVar20;
  uint uVar21;
  uint uVar22;
  ImDrawIdx IVar23;
  ulong uVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  undefined4 in_XMM0_Db;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float *local_c0;
  ulong local_b8;
  ImVec2 local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_6c;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  uint local_4c;
  ulong local_48;
  ImVec2 *local_40;
  ImU32 local_34;
  
  if (1 < points_count) {
    uVar18 = (ulong)(uint)points_count;
    IVar3 = this->_Data->TexUvWhitePixel;
    local_a0 = (ulong)(points_count - 1U);
    local_d8 = (float)CONCAT71(in_register_00000081,closed);
    uVar21 = points_count - 1U;
    if (closed) {
      uVar21 = points_count;
    }
    uVar24 = (ulong)uVar21;
    local_68 = CONCAT44(in_XMM0_Db,thickness);
    local_40 = points;
    if ((this->Flags & 1) == 0) {
      uStack_e0 = 0x12d6b2;
      PrimReserve(this,uVar21 * 6,uVar21 * 4);
      if (0 < (int)uVar21) {
        fVar28 = (float)local_68 * 0.5;
        pIVar16 = local_40;
        uVar8 = 1;
        fVar27 = fVar28;
        fStack_60 = fVar28;
        fStack_5c = fVar28;
        local_48 = uVar18;
        local_34 = col;
        local_68._0_4_ = fVar28;
        local_68._4_4_ = fVar28;
        do {
          uVar9 = uVar8;
          if (uVar18 == uVar8) {
            uVar9 = 0;
          }
          local_98._0_4_ = pIVar16[uVar9].x - pIVar16[uVar8 - 1].x;
          local_98._4_4_ = pIVar16[uVar9].y - pIVar16[uVar8 - 1].y;
          fVar26 = (float)local_98 * (float)local_98 + local_98._4_4_ * local_98._4_4_;
          if (0.0 < fVar26) {
            if (fVar26 < 0.0) {
              uStack_90 = 0;
              uStack_e0 = 0x12d743;
              fVar26 = sqrtf(fVar26);
              pIVar16 = local_40;
              uVar18 = local_48;
              fVar28 = (float)local_68;
              fVar27 = local_68._4_4_;
              col = local_34;
            }
            else {
              fVar26 = SQRT(fVar26);
            }
            local_98._0_4_ = (float)local_98 * (1.0 / fVar26);
            local_98._4_4_ = local_98._4_4_ * (1.0 / fVar26);
          }
          local_98._0_4_ = (float)local_98 * fVar28;
          local_98._4_4_ = local_98._4_4_ * fVar27;
          pIVar4 = this->_VtxWritePtr;
          IVar6.y = pIVar16[uVar8 - 1].y - (float)local_98;
          IVar6.x = pIVar16[uVar8 - 1].x + local_98._4_4_;
          pIVar4->pos = IVar6;
          pIVar4->uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = col;
          pIVar4[1].pos.x = pIVar16[uVar9].x + local_98._4_4_;
          pIVar4[1].pos.y = pIVar16[uVar9].y - (float)local_98;
          pIVar4[1].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = col;
          pIVar4[2].pos.x = pIVar16[uVar9].x - local_98._4_4_;
          pIVar4[2].pos.y = pIVar16[uVar9].y + (float)local_98;
          pIVar4[2].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = col;
          pIVar4[3].pos.x = pIVar16[uVar8 - 1].x - local_98._4_4_;
          pIVar4[3].pos.y = pIVar16[uVar8 - 1].y + (float)local_98;
          pIVar4[3].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = col;
          this->_VtxWritePtr = pIVar4 + 4;
          uVar21 = this->_VtxCurrentIdx;
          pIVar5 = this->_IdxWritePtr;
          IVar7 = (ImDrawIdx)uVar21;
          *pIVar5 = IVar7;
          pIVar5[1] = IVar7 + 1;
          pIVar5[2] = IVar7 + 2;
          pIVar5[3] = IVar7;
          pIVar5[4] = IVar7 + 2;
          pIVar5[5] = IVar7 + 3;
          this->_IdxWritePtr = pIVar5 + 6;
          this->_VtxCurrentIdx = uVar21 + 4;
          bVar25 = uVar8 != uVar24;
          uVar8 = uVar8 + 1;
        } while (bVar25);
      }
    }
    else {
      iVar15 = 0xc;
      if (1.0 < thickness) {
        iVar15 = 0x12;
      }
      local_6c = points_count * 3;
      if (1.0 < thickness) {
        local_6c = points_count * 4;
      }
      uStack_e0 = 0x12d8d4;
      local_b0 = IVar3;
      PrimReserve(this,iVar15 * uVar21,local_6c);
      lVar13 = -((ulong)(((uint)(1.0 < thickness) * 2 + 3) * points_count) * 8 + 0xf &
                0xfffffffffffffff0);
      puVar19 = (undefined8 *)((long)&local_d8 + lVar13);
      local_a8 = uVar18;
      uVar18 = (ulong)(uint)points_count;
      local_b8 = uVar24;
      local_98 = puVar19;
      local_48 = uVar18;
      pIVar16 = local_40;
      if (0 < (int)uVar21) {
        uVar8 = 1;
        do {
          uVar9 = uVar8;
          if (uVar18 == uVar8) {
            uVar9 = 0;
          }
          local_88._0_4_ = pIVar16[uVar9].x - pIVar16[uVar8 - 1].x;
          local_88._4_4_ = pIVar16[uVar9].y - pIVar16[uVar8 - 1].y;
          fVar28 = (float)local_88 * (float)local_88 + local_88._4_4_ * local_88._4_4_;
          if (0.0 < fVar28) {
            if (fVar28 < 0.0) {
              uStack_80 = 0;
              *(undefined8 *)((long)&uStack_e0 + lVar13) = 0x12d988;
              fVar28 = sqrtf(fVar28);
              puVar19 = local_98;
              uVar18 = local_48;
              pIVar16 = local_40;
            }
            else {
              fVar28 = SQRT(fVar28);
            }
            local_88._0_4_ = (float)local_88 * (1.0 / fVar28);
            local_88._4_4_ = local_88._4_4_ * (1.0 / fVar28);
          }
          *(float *)(puVar19 + (uVar8 - 1)) = local_88._4_4_;
          *(float *)((long)puVar19 + uVar8 * 8 + -4) = -(float)local_88;
          bVar25 = uVar8 != uVar24;
          uVar8 = uVar8 + 1;
        } while (bVar25);
      }
      pfVar20 = (float *)(puVar19 + uVar18);
      cVar12 = SUB41(local_d8,0);
      if (cVar12 == '\0') {
        *(undefined8 *)(pfVar20 + -2) = *(undefined8 *)(pfVar20 + -4);
      }
      uVar24 = local_b8;
      local_c0 = pfVar20;
      local_34 = col;
      local_4c = col & 0xffffff;
      iVar15 = (int)local_b8;
      if ((float)local_68 <= 1.0) {
        if (cVar12 == '\0') {
          fVar28 = (float)*puVar19;
          fVar27 = (float)((ulong)*puVar19 >> 0x20);
          fVar26 = (*pIVar16).x;
          fVar29 = (*pIVar16).y;
          *pfVar20 = fVar28 + fVar26;
          pfVar20[1] = fVar27 + fVar29;
          pfVar20[2] = fVar26 - fVar28;
          pfVar20[3] = fVar29 - fVar27;
          uVar8 = local_a0 & 0xffffffff;
          fVar28 = pIVar16[uVar8].x;
          fVar27 = pIVar16[uVar8].y;
          uVar9 = (ulong)(uint)((int)local_a0 * 2);
          *(ulong *)(pfVar20 + uVar9 * 2) =
               CONCAT44((float)((ulong)puVar19[uVar8] >> 0x20) + fVar27,
                        (float)puVar19[uVar8] + fVar28);
          *(ulong *)(pfVar20 + uVar9 * 2 + 2) =
               CONCAT44(fVar27 - (float)((ulong)puVar19[uVar8] >> 0x20),
                        fVar28 - (float)puVar19[uVar8]);
        }
        if (0 < iVar15) {
          lVar10 = -(uVar24 & 0xffffffff);
          uVar24 = 1;
          local_68 = lVar10;
          uVar21 = this->_VtxCurrentIdx;
          do {
            uVar8 = uVar24 & 0xffffffff;
            if (uVar18 == uVar24) {
              uVar8 = 0;
            }
            uVar22 = uVar21 + 3;
            if (uVar18 == uVar24) {
              uVar22 = this->_VtxCurrentIdx;
            }
            local_88._0_4_ = ((float)puVar19[uVar8] + (float)puVar19[uVar24 - 1]) * 0.5;
            local_88._4_4_ =
                 ((float)((ulong)puVar19[uVar8] >> 0x20) +
                 (float)((ulong)puVar19[uVar24 - 1] >> 0x20)) * 0.5;
            fVar28 = (float)local_88 * (float)local_88 + local_88._4_4_ * local_88._4_4_;
            if (1e-06 < fVar28) {
              if (fVar28 < 0.0) {
                uStack_80 = 0;
                *(undefined8 *)((long)&uStack_e0 + lVar13) = 0x12de4a;
                fVar28 = sqrtf(fVar28);
                lVar10 = local_68;
                puVar19 = local_98;
                uVar18 = local_48;
                pIVar16 = local_40;
                pfVar20 = local_c0;
              }
              else {
                fVar28 = SQRT(fVar28);
              }
              fVar27 = 100.0;
              if (1.0 / fVar28 <= 100.0) {
                fVar27 = 1.0 / fVar28;
              }
              local_88._0_4_ = (float)local_88 * fVar27;
              local_88._4_4_ = local_88._4_4_ * fVar27;
            }
            fVar28 = pIVar16[uVar8].x;
            fVar27 = pIVar16[uVar8].y;
            pfVar1 = pfVar20 + (ulong)(uint)((int)uVar8 * 2) * 2;
            *pfVar1 = fVar28 + (float)local_88;
            pfVar1[1] = fVar27 + local_88._4_4_;
            pfVar1[2] = fVar28 - (float)local_88;
            pfVar1[3] = fVar27 - local_88._4_4_;
            pIVar5 = this->_IdxWritePtr;
            IVar7 = (ImDrawIdx)uVar22;
            *pIVar5 = IVar7;
            IVar23 = (ImDrawIdx)uVar21;
            pIVar5[1] = IVar23;
            pIVar5[2] = IVar23 + 2;
            pIVar5[3] = IVar23 + 2;
            pIVar5[4] = IVar7 + 2;
            pIVar5[5] = IVar7;
            pIVar5[6] = IVar7 + 1;
            pIVar5[7] = IVar23 + 1;
            pIVar5[8] = IVar23;
            pIVar5[9] = IVar23;
            pIVar5[10] = IVar7;
            pIVar5[0xb] = IVar7 + 1;
            this->_IdxWritePtr = pIVar5 + 0xc;
            lVar2 = lVar10 + uVar24;
            uVar24 = uVar24 + 1;
            uVar21 = uVar22;
          } while (lVar2 != 0);
        }
        uVar24 = 1;
        if (1 < (int)local_a8) {
          uVar24 = local_a8 & 0xffffffff;
        }
        lVar13 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar16->x + lVar13);
          this->_VtxWritePtr->uv = local_b0;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = local_34;
          pIVar4[1].pos = *(ImVec2 *)((long)puVar19 + lVar13 * 2 + uVar18 * 8);
          this->_VtxWritePtr[1].uv = local_b0;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = local_4c;
          pIVar4[2].pos = *(ImVec2 *)((long)puVar19 + lVar13 * 2 + uVar18 * 8 + 8);
          this->_VtxWritePtr[2].uv = local_b0;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = local_4c;
          this->_VtxWritePtr = pIVar4 + 3;
          lVar13 = lVar13 + 8;
        } while (uVar24 * 8 != lVar13);
      }
      else {
        fVar28 = ((float)local_68 + -1.0) * 0.5;
        if (cVar12 == '\0') {
          fVar27 = fVar28 + 1.0;
          fVar26 = (float)*puVar19;
          fVar29 = (float)((ulong)*puVar19 >> 0x20);
          fVar30 = fVar27 * fVar26;
          fVar31 = fVar27 * fVar29;
          fVar32 = (*pIVar16).x;
          fVar33 = (*pIVar16).y;
          fVar26 = fVar26 * fVar28;
          fVar29 = fVar29 * fVar28;
          *pfVar20 = fVar30 + fVar32;
          pfVar20[1] = fVar31 + fVar33;
          pfVar20[2] = fVar26 + fVar32;
          pfVar20[3] = fVar29 + fVar33;
          pfVar20[4] = fVar32 - fVar26;
          pfVar20[5] = fVar33 - fVar29;
          pfVar20[6] = fVar32 - fVar30;
          pfVar20[7] = fVar33 - fVar31;
          uVar8 = local_a0 & 0xffffffff;
          fVar26 = pIVar16[uVar8].x;
          fVar29 = pIVar16[uVar8].y;
          uVar9 = (ulong)(uint)((int)local_a0 << 2);
          *(ulong *)(pfVar20 + uVar9 * 2) =
               CONCAT44((float)((ulong)puVar19[uVar8] >> 0x20) * fVar27 + fVar29,
                        (float)puVar19[uVar8] * fVar27 + fVar26);
          *(ulong *)(pfVar20 + uVar9 * 2 + 2) =
               CONCAT44((float)((ulong)puVar19[uVar8] >> 0x20) * fVar28 + fVar29,
                        (float)puVar19[uVar8] * fVar28 + fVar26);
          *(ulong *)(pfVar20 + uVar9 * 2 + 4) =
               CONCAT44(fVar29 - (float)((ulong)puVar19[uVar8] >> 0x20) * fVar28,
                        fVar26 - (float)puVar19[uVar8] * fVar28);
          *(ulong *)(pfVar20 + uVar9 * 2 + 6) =
               CONCAT44(fVar29 - (float)((ulong)puVar19[uVar8] >> 0x20) * fVar27,
                        fVar26 - (float)puVar19[uVar8] * fVar27);
        }
        if (0 < iVar15) {
          fVar27 = fVar28 + 1.0;
          local_88 = -(uVar24 & 0xffffffff);
          uVar24 = 1;
          local_d8 = fVar27;
          fStack_d4 = fVar27;
          fStack_d0 = fVar28;
          fStack_cc = fVar28;
          fVar26 = fVar27;
          fVar29 = fVar28;
          uVar21 = this->_VtxCurrentIdx;
          do {
            uVar8 = uVar24 & 0xffffffff;
            if (uVar18 == uVar24) {
              uVar8 = 0;
            }
            uVar22 = uVar21 + 4;
            if (uVar18 == uVar24) {
              uVar22 = this->_VtxCurrentIdx;
            }
            local_68._0_4_ = ((float)puVar19[uVar8] + (float)puVar19[uVar24 - 1]) * 0.5;
            local_68._4_4_ =
                 ((float)((ulong)puVar19[uVar8] >> 0x20) +
                 (float)((ulong)puVar19[uVar24 - 1] >> 0x20)) * 0.5;
            fStack_60 = 0.0;
            fStack_5c = 0.0;
            fVar30 = (float)local_68 * (float)local_68 + local_68._4_4_ * local_68._4_4_;
            if (1e-06 < fVar30) {
              if (fVar30 < 0.0) {
                *(undefined8 *)((long)&uStack_e0 + lVar13) = 0x12db9f;
                fVar30 = sqrtf(fVar30);
                puVar19 = local_98;
                uVar18 = local_48;
                pIVar16 = local_40;
                pfVar20 = local_c0;
                fVar27 = local_d8;
                fVar26 = fStack_d4;
                fVar28 = fStack_d0;
                fVar29 = fStack_cc;
              }
              else {
                fVar30 = SQRT(fVar30);
              }
              fVar31 = 100.0;
              if (1.0 / fVar30 <= 100.0) {
                fVar31 = 1.0 / fVar30;
              }
              local_68._0_4_ = (float)local_68 * fVar31;
              local_68._4_4_ = local_68._4_4_ * fVar31;
            }
            uVar9 = (ulong)(uint)((int)uVar8 * 4);
            fVar30 = pIVar16[uVar8].x;
            fVar31 = pIVar16[uVar8].y;
            pfVar1 = pfVar20 + uVar9 * 2;
            *pfVar1 = fVar30 + (float)local_68 * fVar27;
            pfVar1[1] = fVar31 + local_68._4_4_ * fVar26;
            pfVar1[2] = fVar30 + (float)local_68 * fVar28;
            pfVar1[3] = fVar31 + local_68._4_4_ * fVar29;
            pfVar1 = pfVar20 + uVar9 * 2 + 4;
            *pfVar1 = fVar30 - (float)local_68 * fVar28;
            pfVar1[1] = fVar31 - local_68._4_4_ * fVar29;
            pfVar1[2] = fVar30 - (float)local_68 * fVar27;
            pfVar1[3] = fVar31 - local_68._4_4_ * fVar26;
            IVar7 = (ImDrawIdx)uVar22;
            IVar11 = IVar7 + 1;
            pIVar5 = this->_IdxWritePtr;
            *pIVar5 = IVar11;
            IVar23 = (ImDrawIdx)uVar21;
            pIVar5[1] = IVar23 + 1;
            IVar14 = IVar23 + 2;
            pIVar5[2] = IVar14;
            pIVar5[3] = IVar14;
            IVar17 = IVar7 + 2;
            pIVar5[4] = IVar17;
            pIVar5[5] = IVar11;
            pIVar5[6] = IVar11;
            pIVar5[7] = IVar23 + 1;
            pIVar5[8] = IVar23;
            pIVar5[9] = IVar23;
            pIVar5[10] = IVar7;
            pIVar5[0xb] = IVar11;
            pIVar5[0xc] = IVar17;
            pIVar5[0xd] = IVar14;
            pIVar5[0xe] = IVar23 + 3;
            pIVar5[0xf] = IVar23 + 3;
            pIVar5[0x10] = IVar7 + 3;
            pIVar5[0x11] = IVar17;
            this->_IdxWritePtr = pIVar5 + 0x12;
            lVar10 = local_88 + uVar24;
            uVar24 = uVar24 + 1;
            uVar21 = uVar22;
          } while (lVar10 != 0);
        }
        uVar24 = 1;
        if (1 < (int)local_a8) {
          uVar24 = local_a8 & 0xffffffff;
        }
        lVar13 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar19 + lVar13 + uVar18 * 8);
          this->_VtxWritePtr->uv = local_b0;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = local_4c;
          pIVar4[1].pos = *(ImVec2 *)((long)puVar19 + lVar13 + uVar18 * 8 + 8);
          this->_VtxWritePtr[1].uv = local_b0;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = local_34;
          pIVar4[2].pos = *(ImVec2 *)((long)puVar19 + lVar13 + uVar18 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = local_b0;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = local_34;
          pIVar4[3].pos = *(ImVec2 *)((long)puVar19 + lVar13 + uVar18 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = local_b0;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = local_4c;
          this->_VtxWritePtr = pIVar4 + 4;
          lVar13 = lVar13 + 0x20;
        } while (uVar24 * 0x20 != lVar13);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_6c;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2));
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_NORMALIZE2F_OVER_EPSILON_CLAMP(dm_x, dm_y, 0.000001f, 100.0f)
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_NORMALIZE2F_OVER_EPSILON_CLAMP(dm_x, dm_y, 0.000001f, 100.0f);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertexes
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}